

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.c
# Opt level: O0

ssize_t add_all_files(int fd,char *parent,char *rel,char *host)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  ssize_t sVar3;
  long local_558;
  ssize_t total;
  ssize_t fsize;
  dirent *dent;
  DIR *dir;
  char new_host [1024];
  char new_rel [256];
  char *host_local;
  char *rel_local;
  char *parent_local;
  ssize_t sStack_10;
  int fd_local;
  
  __dirp = opendir(host);
  if (__dirp == (DIR *)0x0) {
    fprintf(_stderr,"cannot open %s\n",host);
    sStack_10 = -1;
  }
  else {
    local_558 = 0;
    while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
      if ((((*rel != '\0') || (iVar1 = strcmp(pdVar2->d_name,"VITA_PATH.TXT"), iVar1 != 0)) &&
          (iVar1 = strcmp(pdVar2->d_name,"."), iVar1 != 0)) &&
         (iVar1 = strcmp(pdVar2->d_name,".."), iVar1 != 0)) {
        if ((*rel == '\0') && (iVar1 = strcmp(pdVar2->d_name,"VITA_DATA.BIN"), iVar1 == 0)) {
          new_host[0x3f8] = '\0';
        }
        else {
          iVar1 = snprintf(new_host + 0x3f8,0x100,"%s/%s",rel,pdVar2->d_name);
          if (iVar1 == 0x100) {
            fprintf(_stderr,"path is too long! cannot add %s/%s\n",rel,pdVar2->d_name);
            goto LAB_0010360a;
          }
        }
        snprintf((char *)&dir,0x400,"%s/%s",host,pdVar2->d_name);
        sVar3 = add_file(fd,parent,new_host + 0x3f8,(char *)&dir);
        if (sVar3 < 0) {
LAB_0010360a:
          closedir(__dirp);
          return -1;
        }
        local_558 = sVar3 + local_558;
      }
    }
    closedir(__dirp);
    sStack_10 = local_558;
  }
  return sStack_10;
}

Assistant:

static ssize_t add_all_files(int fd, const char *parent, const char *rel, const char *host) {
  char new_rel[256];
  char new_host[MAX_PATH_LEN];
  DIR *dir;
  struct dirent *dent;
  ssize_t fsize, total;

  if ((dir = opendir(host)) == NULL) {
    fprintf(stderr, "cannot open %s\n", host);
    return -1;
  }

  total = 0;
  while ((dent = readdir(dir)) != NULL) {
    if (rel[0] == '\0' && strcmp(dent->d_name, "VITA_PATH.TXT") == 0) {
      // skip this file
      continue;
    }

    if (strcmp(dent->d_name, ".") == 0 || strcmp(dent->d_name, "..") == 0) {
      continue;
    }

#ifdef __APPLE__
    if (strcmp(dent->d_name, ".DS_Store") == 0) {
      continue; // ignore annoying OSX specific files
    }
#endif

    if (rel[0] == '\0' && strcmp(dent->d_name, "VITA_DATA.BIN") == 0) { // special file
      new_rel[0] = '\0';
    } else {
      if (snprintf(new_rel, sizeof(new_rel), "%s/%s", rel, dent->d_name) == sizeof(new_rel)) {
        fprintf(stderr, "path is too long! cannot add %s/%s\n", rel, dent->d_name);
        goto err;
      }
    }
    snprintf(new_host, sizeof(new_host), "%s/%s", host, dent->d_name);

    dent = NULL; // so we don't actually reuse it
    // add file/directory to psvimg
    if ((fsize = add_file(fd, parent, new_rel, new_host)) < 0) {
      goto err;
    }
    total += fsize;
  }

  closedir(dir);
  return total;

err:
  closedir(dir);
  return -1;
}